

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O3

void __thiscall kj::anon_unknown_36::HttpEntityBodyReader::doneReading(HttpEntityBodyReader *this)

{
  HttpInputStreamImpl *this_00;
  PromiseFulfiller<void> *pPVar1;
  Disposer *pDVar2;
  Fault local_30;
  undefined8 local_28;
  undefined8 uStack_20;
  
  this_00 = (this->weakInner).ptr;
  getInner((HttpEntityBodyReader *)this_00);
  WrappableStreamMixin<kj::(anonymous_namespace)::HttpInputStreamImpl>::unsetCurrentWrapper
            (&this_00->super_WrappableStreamMixin<kj::(anonymous_namespace)::HttpInputStreamImpl>,
             &this->weakInner);
  this->finished = true;
  pPVar1 = (this_00->onMessageDone).ptr.ptr;
  if (pPVar1 != (PromiseFulfiller<void> *)0x0) {
    (*(pPVar1->super_PromiseRejector)._vptr_PromiseRejector[2])(pPVar1,&local_28);
    pDVar2 = (this_00->onMessageDone).ptr.disposer;
    pPVar1 = (this_00->onMessageDone).ptr.ptr;
    (this_00->onMessageDone).ptr.disposer = (Disposer *)0x0;
    (this_00->onMessageDone).ptr.ptr = (PromiseFulfiller<void> *)0x0;
    if (pPVar1 != (PromiseFulfiller<void> *)0x0) {
      (**pDVar2->_vptr_Disposer)
                (pDVar2,(pPVar1->super_PromiseRejector)._vptr_PromiseRejector[-2] +
                        (long)&(pPVar1->super_PromiseRejector)._vptr_PromiseRejector);
    }
    this_00->pendingMessageCount = this_00->pendingMessageCount - 1;
    return;
  }
  local_30.exception = (Exception *)0x0;
  local_28 = 0;
  uStack_20 = 0;
  kj::_::Debug::Fault::init
            (&local_30,
             (EVP_PKEY_CTX *)
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
            );
  kj::_::Debug::Fault::fatal(&local_30);
}

Assistant:

void doneReading() {
    auto& inner = getInner();
    inner.unsetCurrentWrapper(weakInner);
    finished = true;
    inner.finishRead();
  }